

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

LocVar * localdebuginfo(FuncState *fs,int vidx)

{
  Vardesc *pVVar1;
  int idx;
  Vardesc *vd;
  int vidx_local;
  FuncState *fs_local;
  
  pVVar1 = getlocalvardesc(fs,vidx);
  if ((pVVar1->vd).kind == '\x03') {
    fs_local = (FuncState *)0x0;
  }
  else {
    fs_local = (FuncState *)(fs->f->locvars + (int)(pVVar1->vd).pidx);
  }
  return (LocVar *)fs_local;
}

Assistant:

static LocVar *localdebuginfo (FuncState *fs, int vidx) {
  Vardesc *vd = getlocalvardesc(fs,  vidx);
  if (vd->vd.kind == RDKCTC)
    return NULL;  /* no debug info. for constants */
  else {
    int idx = vd->vd.pidx;
    lua_assert(idx < fs->ndebugvars);
    return &fs->f->locvars[idx];
  }
}